

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3FkRequired(Parse *pParse,Table *pTab,int *aChange,int chngRowid)

{
  byte bVar1;
  u64 uVar2;
  char *pcVar3;
  int iVar4;
  FKey *pFVar5;
  HashElem *pHVar6;
  int iVar7;
  long lVar8;
  bool bVar9;
  
  uVar2 = pParse->db->flags;
  bVar9 = false;
  iVar7 = 1;
  if ((((uint)uVar2 >> 0xe & 1) != 0) && (pTab->eTabType == '\0')) {
    if (aChange == (int *)0x0) {
      pHVar6 = findElementWithHash(&pTab->pSchema->fkeyHash,pTab->zName,(uint *)0x0);
      iVar7 = 1;
      if (pHVar6->data == (void *)0x0) {
        bVar9 = (pTab->u).tab.pFKey != (FKey *)0x0;
      }
      else {
        bVar9 = true;
      }
    }
    else {
      pFVar5 = (pTab->u).tab.pFKey;
      bVar9 = false;
      if (pFVar5 != (FKey *)0x0) {
LAB_001a43cf:
        if (0 < (long)pFVar5->nCol) {
          lVar8 = 0;
          do {
            iVar4 = *(int *)((long)&pFVar5->aCol[0].iFrom + lVar8);
            if ((-1 < aChange[iVar4]) || ((chngRowid != 0 && (iVar4 == pTab->iPKey)))) {
              pcVar3 = pFVar5->zTo;
              if (pTab->zName == (char *)0x0) {
                if (pcVar3 == (char *)0x0) {
                  iVar7 = 2;
                }
                bVar9 = true;
              }
              else {
                bVar9 = true;
                if (pcVar3 != (char *)0x0) {
                  lVar8 = 0;
                  goto LAB_001a441d;
                }
              }
              break;
            }
            lVar8 = lVar8 + 0x10;
          } while ((long)pFVar5->nCol * 0x10 != lVar8);
        }
        goto LAB_001a4455;
      }
LAB_001a4462:
      pHVar6 = findElementWithHash(&pTab->pSchema->fkeyHash,pTab->zName,(uint *)0x0);
      pFVar5 = (FKey *)pHVar6->data;
      if (pFVar5 != (FKey *)0x0) {
        do {
          iVar4 = fkParentIsModified(pTab,pFVar5,aChange,chngRowid);
          if (iVar4 != 0) {
            bVar9 = true;
          }
          if ((iVar4 != 0 && ((uint)(uVar2 >> 0x23) & 1) == 0) &&
             (bVar9 = true, pFVar5->aAction[1] != '\0')) {
            return 2;
          }
          pFVar5 = pFVar5->pNextTo;
        } while (pFVar5 != (FKey *)0x0);
      }
    }
  }
  if (!bVar9) {
    iVar7 = 0;
  }
  return iVar7;
LAB_001a441d:
  bVar1 = pTab->zName[lVar8];
  if (bVar1 == pcVar3[lVar8]) {
    if ((ulong)bVar1 == 0) goto LAB_001a4450;
  }
  else if (""[bVar1] != ""[(byte)pcVar3[lVar8]]) goto LAB_001a4455;
  lVar8 = lVar8 + 1;
  goto LAB_001a441d;
LAB_001a4450:
  iVar7 = 2;
LAB_001a4455:
  pFVar5 = pFVar5->pNextFrom;
  if (pFVar5 == (FKey *)0x0) goto LAB_001a4462;
  goto LAB_001a43cf;
}

Assistant:

SQLITE_PRIVATE int sqlite3FkRequired(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Table being modified */
  int *aChange,                   /* Non-NULL for UPDATE operations */
  int chngRowid                   /* True for UPDATE that affects rowid */
){
  int eRet = 1;                   /* Value to return if bHaveFK is true */
  int bHaveFK = 0;                /* If FK processing is required */
  if( pParse->db->flags&SQLITE_ForeignKeys && IsOrdinaryTable(pTab) ){
    if( !aChange ){
      /* A DELETE operation. Foreign key processing is required if the
      ** table in question is either the child or parent table for any
      ** foreign key constraint.  */
      bHaveFK = (sqlite3FkReferences(pTab) || pTab->u.tab.pFKey);
    }else{
      /* This is an UPDATE. Foreign key processing is only required if the
      ** operation modifies one or more child or parent key columns. */
      FKey *p;

      /* Check if any child key columns are being modified. */
      for(p=pTab->u.tab.pFKey; p; p=p->pNextFrom){
        if( fkChildIsModified(pTab, p, aChange, chngRowid) ){
          if( 0==sqlite3_stricmp(pTab->zName, p->zTo) ) eRet = 2;
          bHaveFK = 1;
        }
      }

      /* Check if any parent key columns are being modified. */
      for(p=sqlite3FkReferences(pTab); p; p=p->pNextTo){
        if( fkParentIsModified(pTab, p, aChange, chngRowid) ){
          if( (pParse->db->flags & SQLITE_FkNoAction)==0
           && p->aAction[1]!=OE_None
          ){
            return 2;
          }
          bHaveFK = 1;
        }
      }
    }
  }
  return bHaveFK ? eRet : 0;
}